

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O2

ecs_iter_t *
ecs_query_iter_page(ecs_iter_t *__return_storage_ptr__,ecs_query_t *query,int32_t offset,
                   int32_t limit)

{
  ecs_world_t *world;
  ecs_table_t *table;
  uint uVar1;
  int32_t iVar2;
  void *pvVar3;
  int32_t *piVar4;
  int iVar5;
  long lVar6;
  ecs_vector_t *vector;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  
  _ecs_assert(query != (ecs_query_t *)0x0,2,(char *)0x0,"query != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
              ,0x923);
  if (query == (ecs_query_t *)0x0) {
    __assert_fail("query != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                  ,0x923,"ecs_iter_t ecs_query_iter_page(ecs_query_t *, int32_t, int32_t)");
  }
  _ecs_assert((query->flags >> 9 & 1) == 0,2,(char *)0x0,"!(query->flags & EcsQueryIsOrphaned)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
              ,0x924);
  if ((query->flags & 0x200) != 0) {
    __assert_fail("!(query->flags & (512))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                  ,0x924,"ecs_iter_t ecs_query_iter_page(ecs_query_t *, int32_t, int32_t)");
  }
  world = query->world;
  if (query->needs_reorder == true) {
    order_ranked_tables(world,query);
  }
  sort_tables(world,query);
  if ((world->in_progress == false) && ((query->flags & 0x40) != 0)) {
    ecs_eval_component_monitors(world);
  }
  query->prev_match_count = query->match_count;
  uVar1 = ecs_vector_count(query->tables);
  pvVar3 = _ecs_vector_first(query->tables,0x50,0x10);
  uVar7 = 0;
  uVar8 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar8 = uVar7;
  }
  while ((uVar7 != uVar8 && (lVar9 = uVar7 * 0x50, *(long *)((long)pvVar3 + lVar9 + 0x40) != 0))) {
    table = *(ecs_table_t **)((long)pvVar3 + lVar9 + 8);
    piVar4 = ecs_table_get_dirty_state(table);
    iVar5 = table->column_count;
    if (iVar5 < 0) {
      iVar5 = -1;
    }
    for (lVar6 = 0; (long)iVar5 + 1 != lVar6; lVar6 = lVar6 + 1) {
      *(int32_t *)(*(long *)((long)pvVar3 + lVar9 + 0x40) + lVar6 * 4) = piVar4[lVar6];
    }
    uVar7 = uVar7 + 1;
  }
  vector = query->table_slices;
  if (vector == (ecs_vector_t *)0x0) {
    vector = query->tables;
  }
  iVar2 = ecs_vector_count(vector);
  memset(&__return_storage_ptr__->real_world,0,0xd8);
  __return_storage_ptr__->world = world;
  __return_storage_ptr__->query = query;
  __return_storage_ptr__->table_count = iVar2;
  iVar2 = ecs_vector_count(query->empty_tables);
  __return_storage_ptr__->inactive_table_count = iVar2;
  iVar2 = ecs_vector_count((query->sig).columns);
  __return_storage_ptr__->column_count = iVar2;
  (__return_storage_ptr__->iter).query.page_iter.offset = offset;
  (__return_storage_ptr__->iter).query.page_iter.limit = limit;
  (__return_storage_ptr__->iter).query.page_iter.remaining = limit;
  *(undefined8 *)((long)&(__return_storage_ptr__->iter).parent.filter.exclude + 4) = 0;
  *(undefined8 *)&(__return_storage_ptr__->iter).parent.filter.exclude_kind = 0;
  return __return_storage_ptr__;
}

Assistant:

ecs_iter_t ecs_query_iter_page(
    ecs_query_t *query,
    int32_t offset,
    int32_t limit)
{
    ecs_assert(query != NULL, ECS_INVALID_PARAMETER, NULL);
    ecs_assert(!(query->flags & EcsQueryIsOrphaned), ECS_INVALID_PARAMETER, NULL);

    ecs_world_t *world = query->world;

    if (query->needs_reorder) {
        order_ranked_tables(world, query);
    }
    
    sort_tables(world, query);

    if (!world->in_progress && query->flags & EcsQueryHasRefs) {
        ecs_eval_component_monitors(world);
    }

    tables_reset_dirty(query);

    int32_t table_count;
    if (query->table_slices) {
        table_count = ecs_vector_count(query->table_slices);
    } else {
        table_count = ecs_vector_count(query->tables);
    }

    ecs_query_iter_t it = {
        .page_iter = {
            .offset = offset,
            .limit = limit,
            .remaining = limit
        },
        .index = 0,
    };

    return (ecs_iter_t){
        .world = world,
        .query = query,
        .column_count = ecs_vector_count(query->sig.columns),
        .table_count = table_count,
        .inactive_table_count = ecs_vector_count(query->empty_tables),
        .iter.query = it
    };
}